

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  xpath_value_type xVar1;
  xpath_variable *pxVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  xpath_variable *pxVar5;
  uint uVar6;
  char cVar7;
  
  cVar7 = *name;
  if (cVar7 == '\0') {
    pxVar5 = (xpath_variable *)0x0;
  }
  else {
    pcVar4 = name + 1;
    uVar6 = 0;
    do {
      uVar6 = ((int)cVar7 + uVar6) * 0x401;
      uVar6 = uVar6 >> 6 ^ uVar6;
      cVar7 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar7 != '\0');
    pxVar5 = (xpath_variable *)(ulong)(uVar6 * 9);
  }
  uVar6 = ((uint)((ulong)pxVar5 >> 0xb) ^ (uint)pxVar5) & 0x3f;
  pxVar2 = this->_data[uVar6];
  do {
    if (pxVar2 == (xpath_variable *)0x0) {
LAB_00128191:
      if ((pxVar2 == (xpath_variable *)0x0) &&
         (pxVar5 = impl::anon_unknown_0::new_xpath_variable(type,name),
         pxVar5 != (xpath_variable *)0x0)) {
        pxVar5->_next = this->_data[uVar6];
        this->_data[uVar6] = pxVar5;
      }
      return pxVar5;
    }
    xVar1 = pxVar2->_type;
    iVar3 = strcmp((char *)((long)&pxVar2->_type + *(long *)(L"wb" + (long)(int)xVar1 * 2 + 2)),name
                  );
    pxVar5 = (xpath_variable *)CONCAT44(extraout_var,iVar3);
    if (iVar3 == 0) {
      pxVar5 = (xpath_variable *)0x0;
      if (xVar1 == type) {
        pxVar5 = pxVar2;
      }
      goto LAB_00128191;
    }
    pxVar2 = pxVar2->_next;
  } while( true );
}

Assistant:

PUGI_IMPL_FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : NULL;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}